

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iraffits.c
# Opt level: O0

int machswap(void)

{
  int itest;
  char *ctest;
  
  return 1;
}

Assistant:

static int
machswap (void)

{
    char *ctest;
    int itest;

    itest = 1;
    ctest = (char *)&itest;
    if (*ctest)
	return (1);
    else
	return (0);
}